

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * generate(void)

{
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *unaff_retaddr;
  string *in_stack_00000008;
  string *in_stack_00000010;
  RPCHelpMan *in_stack_00000018;
  RPCMethodImpl *in_stack_00000110;
  initializer_list<RPCResult> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  RPCHelpMan *this_01;
  allocator<char> *in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  RPCHelpMan *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1 [41];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  allocator<char> local_8a;
  allocator<char> local_89 [121];
  RPCExamples *in_stack_fffffffffffffff0;
  RPCResults *results_00;
  
  results_00 = *(RPCResults **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_02 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_02->m_name,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_02->m_name,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffea8);
  std::initializer_list<RPCResult>::initializer_list(in_stack_fffffffffffffea8);
  results._M_len = (size_type)this_02;
  results._M_array = in_stack_fffffffffffffef0;
  RPCResults::RPCResults((RPCResults *)this_01,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_02->m_name,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffea8,(string *)0x61c9fa);
  this = &local_f8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<generate()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this,
             in_stack_fffffffffffffeb0);
  this_00 = this;
  RPCHelpMan::RPCHelpMan
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,results_00,
             in_stack_fffffffffffffff0,in_stack_00000110);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_d1);
  RPCResults::~RPCResults((RPCResults *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_00);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(&local_8a);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_89);
  if (*(RPCResults **)(in_FS_OFFSET + 0x28) == results_00) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan generate()
{
    return RPCHelpMan{"generate", "has been replaced by the -generate cli option. Refer to -help for more information.", {}, {}, RPCExamples{""}, [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
        throw JSONRPCError(RPC_METHOD_NOT_FOUND, self.ToString());
    }};
}